

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

sat_solver * IPdr_ManSetSolver(Pdr_Man_t *p,int k,int fSetPropOutput)

{
  sat_solver *psVar1;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pCube;
  int i;
  int i_00;
  
  if (p->vSolvers->nSize != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0xdf,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  if (p->vActVars->nSize != k) {
    __assert_fail("Vec_IntSize(p->vActVars) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0xe0,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  psVar1 = zsat_solver_new_seed((double)p->pPars->nRandomSeed);
  psVar1 = Pdr_ManNewSolver(psVar1,p,k,(uint)(k == 0));
  Vec_PtrPush(p->vSolvers,psVar1);
  Vec_IntPush(p->vActVars,0);
  if (fSetPropOutput != 0) {
    Pdr_ManSetPropertyOutput(p,k);
  }
  i = k;
  if (k != 0) {
    for (; i < p->vClauses->nSize; i = i + 1) {
      p_00 = Vec_VecEntry(p->vClauses,i);
      for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
        pCube = (Pdr_Set_t *)Vec_PtrEntry(p_00,i_00);
        Pdr_ManSolverAddClause(p,k,pCube);
      }
    }
  }
  return psVar1;
}

Assistant:

sat_solver * IPdr_ManSetSolver( Pdr_Man_t * p, int k, int fSetPropOutput )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;

    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_IntSize(p->vActVars) == k );

    pSat = zsat_solver_new_seed(p->pPars->nRandomSeed);
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_IntPush( p->vActVars, 0 );

    // set the property output
    if ( fSetPropOutput )
        Pdr_ManSetPropertyOutput( p, k );

    if (k == 0)
        return pSat;

    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}